

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cxx::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,cxx *this,FieldDescriptor *field)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  size_type sVar4;
  pointer pcVar5;
  size_type sVar6;
  size_type sVar7;
  
  plVar2 = *(long **)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar3 = *plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar3,plVar2[1] + lVar3);
  sVar4 = __return_storage_ptr__->_M_string_length;
  if (sVar4 != 0) {
    pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      bVar1 = pcVar5[sVar7];
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        pcVar5[sVar7] = bVar1 | 0x20;
      }
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
  }
  sVar6 = std::tr1::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                   *)(anonymous_namespace)::kKeywords_abi_cxx11_,__return_storage_ptr__);
  if (sVar6 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  string result = field->name();
  LowerString(&result);
  if (kKeywords.count(result) > 0) {
    result.append("_");
  }
  return result;
}